

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

bool __thiscall ON_Brep::CloseTrimGap(ON_Brep *this,ON_BrepTrim *trim0,ON_BrepTrim *trim1)

{
  double dVar1;
  double dVar2;
  ISO IVar3;
  ISO IVar4;
  ON_BrepLoop *pOVar5;
  int *piVar6;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  int iVar7;
  double *pdVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  ON_3dPoint p;
  ON_3dPoint p1;
  ON_3dPoint p0;
  ON_Line local_88;
  ON_3dPoint local_58;
  ON_Interval domain1;
  ON_Interval domain0;
  
  if (trim0->m_vi[1] != trim1->m_vi[0]) {
    return false;
  }
  iVar7 = trim0->m_li;
  lVar10 = (long)iVar7;
  if (lVar10 < 0) {
    return false;
  }
  if (iVar7 != trim1->m_li) {
    return false;
  }
  if ((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count <=
      iVar7) {
    return false;
  }
  pOVar5 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
  uVar9 = pOVar5[lVar10].m_ti.m_count;
  if (trim0->m_trim_index == trim1->m_trim_index && uVar9 == 1) {
    iVar7 = (*(trim0->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
              _vptr_ON_Object[0x34])(trim0);
    if ((char)iVar7 != '\0') {
      return true;
    }
    uVar9 = pOVar5[lVar10].m_ti.m_count;
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    uVar12 = 0;
    if (0 < (int)uVar9) {
      uVar12 = (ulong)uVar9;
    }
    while( true ) {
      if (uVar12 == uVar11) {
        return false;
      }
      piVar6 = pOVar5[lVar10].m_ti.m_a;
      if ((piVar6[uVar11] == trim0->m_trim_index) &&
         (piVar6[(long)((int)uVar11 + 1) % (long)(int)uVar9 & 0xffffffff] == trim1->m_trim_index))
      break;
      uVar11 = uVar11 + 1;
    }
  }
  if ((int)uVar9 <= (int)uVar11) {
    return false;
  }
  (*(trim0->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
    [0x25])(trim0);
  (*(trim1->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
    [0x25])(trim1);
  pdVar8 = ON_Interval::operator[](&domain0,1);
  dVar1 = *pdVar8;
  pdVar8 = ON_Interval::operator[](&domain1,0);
  dVar2 = *pdVar8;
  ON_Curve::EvPoint((ON_Curve *)trim0,dVar1,&p0,0,(int *)0x0);
  ON_Curve::EvPoint((ON_Curve *)trim1,dVar2,&p1,0,(int *)0x0);
  p0.z = 0.0;
  p1.z = 0.0;
  from_pt.y._0_4_ = SUB84(p0.y,0);
  from_pt.x = p0.x;
  from_pt.y._4_4_ = (int)((ulong)p0.y >> 0x20);
  from_pt.z = 0.0;
  to_pt.y = p1.y;
  to_pt.x = p1.x;
  to_pt.z = 0.0;
  ON_Line::ON_Line(&local_88,from_pt,to_pt);
  ON_Line::PointAt(&p,&local_88,0.5);
  ON_Line::~ON_Line(&local_88);
  uVar13 = SUB84(p0.x,0);
  uVar14 = (undefined4)((ulong)p0.x >> 0x20);
  if ((p0.x == p1.x) && (!NAN(p0.x) && !NAN(p1.x))) {
    p.x = p0.x;
  }
  if ((p0.y == p1.y) && (!NAN(p0.y) && !NAN(p1.y))) {
    p.y = p0.y;
  }
  IVar3 = trim0->m_iso;
  if (IVar3 - x_iso < 6) {
    iVar7 = *(int *)(&DAT_006a1940 + (ulong)(IVar3 - x_iso) * 4);
  }
  else {
    iVar7 = -1;
  }
  IVar4 = trim1->m_iso;
  if (IVar4 < iso_count) {
    if ((0x2aU >> (IVar4 & 0x1f) & 1) == 0) {
      if ((0x54U >> (IVar4 & 0x1f) & 1) != 0) {
        if (iVar7 == 1) {
          if (IVar3 != x_iso) {
            ON_Curve::PointAtStart(&local_88.from,(ON_Curve *)trim0);
            dVar1 = ON_3dPoint::DistanceTo(&p0,&local_88.from);
            ON_Curve::PointAtEnd(&local_58,(ON_Curve *)trim1);
            dVar2 = ON_3dPoint::DistanceTo(&p1,&local_58);
            if (dVar2 <= dVar1) {
              uVar13 = SUB84(p0.y,0);
              uVar14 = (undefined4)((ulong)p0.y >> 0x20);
            }
            else {
              uVar13 = SUB84(p1.y,0);
              uVar14 = (undefined4)((ulong)p1.y >> 0x20);
            }
            p.y = (double)CONCAT44(uVar14,uVar13);
            goto LAB_0043dc52;
          }
        }
        else {
          if (iVar7 != 0) goto LAB_0043dba8;
          p.x = p0.x;
        }
        p.y = p1.y;
        goto LAB_0043dc52;
      }
      goto LAB_0043dbcb;
    }
    if (iVar7 == 1) {
      p.x = p1.x;
      goto LAB_0043dbd6;
    }
    if ((iVar7 != 0) || (IVar4 != x_iso && IVar3 == x_iso)) {
LAB_0043dba8:
      p.x = p1.x;
      goto LAB_0043dc52;
    }
    if (IVar3 == x_iso || IVar4 != x_iso) {
      ON_Curve::PointAtStart(&local_88.from,(ON_Curve *)trim0);
      dVar1 = ON_3dPoint::DistanceTo(&p0,&local_88.from);
      ON_Curve::PointAtEnd(&local_58,(ON_Curve *)trim1);
      dVar2 = ON_3dPoint::DistanceTo(&p1,&local_58);
      if (dVar2 <= dVar1) {
        uVar13 = SUB84(p0.x,0);
        uVar14 = (undefined4)((ulong)p0.x >> 0x20);
      }
      else {
        uVar13 = SUB84(p1.x,0);
        uVar14 = (undefined4)((ulong)p1.x >> 0x20);
      }
    }
  }
  else {
LAB_0043dbcb:
    if (iVar7 == 1) {
LAB_0043dbd6:
      p.y = p0.y;
      goto LAB_0043dc52;
    }
    if (iVar7 != 0) goto LAB_0043dc52;
  }
  p.x = (double)CONCAT44(uVar14,uVar13);
LAB_0043dc52:
  iVar7 = ON_ComparePoint(3,false,&p.x,&p0.x);
  if (iVar7 != 0) {
    (*(trim0->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
      [0x3a])(trim0);
  }
  iVar7 = ON_ComparePoint(3,false,&p.x,&p1.x);
  if (iVar7 != 0) {
    (*(trim1->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
      [0x39])(trim1);
  }
  return true;
}

Assistant:

bool ON_Brep::CloseTrimGap( ON_BrepTrim& trim0, ON_BrepTrim& trim1 )
{

  // carefully close gap between end of prev_trim and start of next_trim

  // make sure trim0 and trim1 are adjacent trims in a trimming loop
  if ( trim0.m_vi[1] != trim1.m_vi[0] )
    return false;
  if ( trim0.m_li != trim1.m_li )
    return false;
  if ( trim0.m_li < 0 || trim0.m_li >= m_L.Count() )
    return false;
  ON_BrepLoop& loop = m_L[trim0.m_li];
  int lti;
  if ( loop.m_ti.Count() == 1 && trim0.m_trim_index == trim1.m_trim_index )
  {
    if ( trim0.IsClosed() )
      return true;
    lti = 0;
  }
  else
  {
    for ( lti = 0; lti < loop.m_ti.Count(); lti++ )
    {
      if ( loop.m_ti[lti] == trim0.m_trim_index && loop.m_ti[(lti+1)%loop.m_ti.Count()] == trim1.m_trim_index )
        break;
    }
  }
  if ( lti >= loop.m_ti.Count() )
    return false;

  // determine where trims end and where they should meet.
  ON_Interval domain0 = trim0.Domain();
  ON_Interval domain1 = trim1.Domain();
  double t0 = domain0[1];
  double t1 = domain1[0];
  ON_3dPoint p0, p1;
  trim0.EvPoint( t0, p0 );
  trim1.EvPoint( t1, p1 );
  p0.z = 0.0;
  p1.z = 0.0;
  ON_3dPoint p = ON_Line(p0,p1).PointAt(0.5);
  if ( p0.x == p1.x )
    p.x = p0.x;
  if ( p0.y == p1.y )
    p.y = p0.y;

  int coord0_lock = -1;
  int coord1_lock = -1;
  switch(trim0.m_iso)
  {
  case ON_Surface::x_iso:
  case ON_Surface::W_iso:
  case ON_Surface::E_iso:
    // vertical iso curve - lock x coordinate
    coord0_lock = 0;
    break;
  case ON_Surface::y_iso:
  case ON_Surface::S_iso:
  case ON_Surface::N_iso:
    // horizontal iso curve - lock y coordinate
    coord0_lock = 1;
    break;
  default:
    coord0_lock = -1;
  }

  switch(trim1.m_iso)
  {
  case ON_Surface::x_iso:
  case ON_Surface::W_iso:
  case ON_Surface::E_iso:
    // vertical iso curve - lock x coordinate
    coord1_lock = 0;
    switch(coord0_lock)
    {
    case 0:
      if ( ON_Surface::x_iso == trim0.m_iso && ON_Surface::x_iso != trim1.m_iso )
        p.x = p1.x; // trim1 is on surface edge
      else if ( ON_Surface::x_iso != trim0.m_iso && ON_Surface::x_iso == trim1.m_iso )
        p.x = p0.x; // trim0 is on surface edge
      else
      {
        // longest one wins
        if ( p0.DistanceTo(trim0.PointAtStart()) >= p1.DistanceTo(trim1.PointAtEnd()) )
          p.x = p0.x;
        else
          p.x = p1.x;
      }
      break;
    case 1:
      p.x = p1.x;
      p.y = p0.y;
      break;
    default:
      p.x = p1.x;
      break;
    }
    break;
  case ON_Surface::y_iso:
  case ON_Surface::S_iso:
  case ON_Surface::N_iso:
    // horizontal iso curve - lock y coordinate
    coord1_lock = 1;
    switch(coord0_lock)
    {
    case 0:
      p.x = p0.x;
      p.y = p1.y;
      break;
    case 1:
      if ( ON_Surface::x_iso == trim0.m_iso && ON_Surface::x_iso != trim1.m_iso )
        p.y = p1.y; // trim1 is on surface edge
      else if ( ON_Surface::x_iso != trim0.m_iso && ON_Surface::x_iso == trim1.m_iso )
        p.y = p0.y; // trim0 is on surface edge
      else
      {
        // longest one wins
        if ( p0.DistanceTo(trim0.PointAtStart()) >= p1.DistanceTo(trim1.PointAtEnd()) )
          p.y = p0.y;
        else
          p.y = p1.y;
      }
      break;
    default:
      p.x = p1.x;
      break;
    }
    break;
  default:
    switch(coord0_lock)
    {
    case 0:
      p.x = p0.x;
      break;
    case 1:
      p.y = p0.y;
      break;
    }
    break;
  }

  if (ON_ComparePoint(3,0,&p.x,&p0.x))
  {
    trim0.SetEndPoint(p);
  }
  if (ON_ComparePoint(3,0,&p.x,&p1.x))
  {
    trim1.SetStartPoint(p);
  }

  return true;
}